

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

void __thiscall cmCTestGIT::DiffParser::~DiffParser(DiffParser *this)

{
  ~DiffParser(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

DiffParser(cmCTestGIT* git, const char* prefix)
    : LineParser('\0', false)
    , GIT(git)
  {
    this->SetLog(&git->Log, prefix);
  }